

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict pre_left_op(c2m_ctx_t c2m_ctx,int token,int token2,_func_node_t_c2m_ctx_t *f)

{
  int iVar1;
  node_t_conflict op;
  bool bVar2;
  undefined1 local_50 [8];
  pos_t pos;
  node_t_conflict n;
  node_t_conflict r;
  _func_node_t_c2m_ctx_t *p_Stack_28;
  node_code_t code;
  _func_node_t_c2m_ctx_t *f_local;
  int token2_local;
  int token_local;
  c2m_ctx_t c2m_ctx_local;
  
  p_Stack_28 = f;
  f_local._0_4_ = token2;
  f_local._4_4_ = token;
  _token2_local = c2m_ctx;
  n = (*f)(c2m_ctx);
  c2m_ctx_local = (c2m_ctx_t)n;
  if ((c2m_ctx_t)n != (c2m_ctx_t)0x0) {
    while( true ) {
      iVar1 = pre_match(_token2_local,f_local._4_4_,(pos_t *)local_50,(node_code_t *)((long)&r + 4),
                        (node_t_conflict *)0x0);
      bVar2 = true;
      if ((iVar1 == 0) && (bVar2 = false, -1 < (int)f_local)) {
        iVar1 = pre_match(_token2_local,(int)f_local,(pos_t *)local_50,(node_code_t *)((long)&r + 4)
                          ,(node_t_conflict *)0x0);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        return n;
      }
      pos._8_8_ = new_pos_node1(_token2_local,r._4_4_,_local_50,n);
      op = (*p_Stack_28)(_token2_local);
      if (op == (node_t_conflict)0x0) break;
      op_append(_token2_local,(node_t_conflict)pos._8_8_,op);
      n = (node_t_conflict)pos._8_8_;
    }
    c2m_ctx_local = (c2m_ctx_t)0x0;
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

static node_t pre_left_op (c2m_ctx_t c2m_ctx, int token, int token2,
                           node_t (*f) (c2m_ctx_t c2m_ctx)) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  if ((r = f (c2m_ctx)) == NULL) return r;
  while (pre_match (c2m_ctx, token, &pos, &code, NULL)
         || (token2 >= 0 && pre_match (c2m_ctx, token2, &pos, &code, NULL))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    if ((r = f (c2m_ctx)) == NULL) return r;
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}